

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Log::backward_impl
          (Log *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ushort uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  int iVar28;
  int iVar29;
  
  uVar13 = (ulong)(dEdf->d).nd;
  iVar29 = 1;
  iVar28 = 1;
  if (uVar13 != 0) {
    auVar20 = vpbroadcastq_avx512f();
    auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar14 = 0;
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar24 = vmovdqa64_avx512f(auVar21);
      auVar21 = vpbroadcastq_avx512f();
      auVar25 = vporq_avx512f(auVar21,auVar22);
      auVar21 = vporq_avx512f(auVar21,auVar23);
      uVar8 = vpcmpuq_avx512f(auVar21,auVar20,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar25,auVar20,2);
      bVar10 = (byte)uVar8;
      uVar18 = CONCAT11(bVar10,bVar9);
      auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar14));
      auVar25._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar21._4_4_;
      auVar25._0_4_ = (uint)(bVar9 & 1) * auVar21._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar21._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar21._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar21._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar21._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar21._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar21._28_4_;
      auVar25._32_4_ = (uint)(bVar10 & 1) * auVar21._32_4_;
      auVar25._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar21._36_4_;
      auVar25._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar21._40_4_;
      auVar25._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar21._44_4_;
      auVar25._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar21._48_4_;
      auVar25._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar21._52_4_;
      auVar25._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar21._56_4_;
      auVar25._60_4_ = (uint)(bVar10 >> 7) * auVar21._60_4_;
      auVar21 = vpmulld_avx512f(auVar25,auVar24);
      uVar14 = uVar14 + 0x10;
    } while ((uVar13 + 0xf & 0x1fffffff0) != uVar14);
    auVar20 = vmovdqa32_avx512f(auVar21);
    auVar21._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar24._0_4_;
    bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar24._4_4_;
    bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar24._8_4_;
    bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar24._12_4_;
    bVar5 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * auVar24._16_4_;
    bVar5 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * auVar24._20_4_;
    bVar5 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * auVar24._24_4_;
    bVar5 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * auVar24._28_4_;
    auVar21._32_4_ =
         (uint)(bVar10 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar24._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar5 * auVar20._36_4_ | (uint)!bVar5 * auVar24._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar5 * auVar20._40_4_ | (uint)!bVar5 * auVar24._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar5 * auVar20._44_4_ | (uint)!bVar5 * auVar24._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar5 * auVar20._48_4_ | (uint)!bVar5 * auVar24._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar5 * auVar20._52_4_ | (uint)!bVar5 * auVar24._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar5 * auVar20._56_4_ | (uint)!bVar5 * auVar24._56_4_;
    auVar21._60_4_ =
         (uint)(bVar10 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar24._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar21,1);
    auVar20 = vpmulld_avx512f(auVar21,ZEXT3264(auVar19));
    auVar6 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    iVar28 = auVar6._0_4_;
  }
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar13 = (ulong)(pTVar1->d).nd;
  if (uVar13 != 0) {
    auVar20 = vpbroadcastq_avx512f();
    auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar14 = 0;
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar24 = vmovdqa64_avx512f(auVar21);
      auVar21 = vpbroadcastq_avx512f();
      auVar25 = vporq_avx512f(auVar21,auVar22);
      auVar21 = vporq_avx512f(auVar21,auVar23);
      uVar8 = vpcmpuq_avx512f(auVar21,auVar20,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar25,auVar20,2);
      bVar10 = (byte)uVar8;
      uVar18 = CONCAT11(bVar10,bVar9);
      auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar14));
      auVar26._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar21._4_4_;
      auVar26._0_4_ = (uint)(bVar9 & 1) * auVar21._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar21._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar21._12_4_;
      auVar26._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar21._16_4_;
      auVar26._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar21._20_4_;
      auVar26._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar21._24_4_;
      auVar26._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar21._28_4_;
      auVar26._32_4_ = (uint)(bVar10 & 1) * auVar21._32_4_;
      auVar26._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar21._36_4_;
      auVar26._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar21._40_4_;
      auVar26._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar21._44_4_;
      auVar26._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar21._48_4_;
      auVar26._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar21._52_4_;
      auVar26._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar21._56_4_;
      auVar26._60_4_ = (uint)(bVar10 >> 7) * auVar21._60_4_;
      auVar21 = vpmulld_avx512f(auVar26,auVar24);
      uVar14 = uVar14 + 0x10;
    } while ((uVar13 + 0xf & 0x1fffffff0) != uVar14);
    auVar20 = vmovdqa32_avx512f(auVar21);
    auVar22._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar24._0_4_;
    bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar24._4_4_;
    bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar24._8_4_;
    bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar24._12_4_;
    bVar5 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * auVar24._16_4_;
    bVar5 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * auVar24._20_4_;
    bVar5 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * auVar24._24_4_;
    bVar5 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * auVar24._28_4_;
    auVar22._32_4_ =
         (uint)(bVar10 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar24._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar5 * auVar20._36_4_ | (uint)!bVar5 * auVar24._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar5 * auVar20._40_4_ | (uint)!bVar5 * auVar24._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar5 * auVar20._44_4_ | (uint)!bVar5 * auVar24._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar5 * auVar20._48_4_ | (uint)!bVar5 * auVar24._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar5 * auVar20._52_4_ | (uint)!bVar5 * auVar24._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar5 * auVar20._56_4_ | (uint)!bVar5 * auVar24._56_4_;
    auVar22._60_4_ =
         (uint)(bVar10 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar24._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar22,1);
    auVar20 = vpmulld_avx512f(auVar22,ZEXT3264(auVar19));
    auVar6 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    iVar29 = auVar6._0_4_;
  }
  uVar11 = iVar29 * (pTVar1->d).bd;
  if (iVar28 * (dEdf->d).bd != uVar11) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  uVar13 = (ulong)(dEdxi->d).nd;
  if (uVar13 == 0) {
    iVar29 = 1;
  }
  else {
    auVar20 = vpbroadcastq_avx512f();
    auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar14 = 0;
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar24 = vmovdqa64_avx512f(auVar21);
      auVar21 = vpbroadcastq_avx512f();
      auVar25 = vporq_avx512f(auVar21,auVar22);
      auVar21 = vporq_avx512f(auVar21,auVar23);
      uVar8 = vpcmpuq_avx512f(auVar21,auVar20,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar25,auVar20,2);
      bVar10 = (byte)uVar8;
      uVar18 = CONCAT11(bVar10,bVar9);
      auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar14));
      auVar27._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar21._4_4_;
      auVar27._0_4_ = (uint)(bVar9 & 1) * auVar21._0_4_;
      auVar27._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar21._8_4_;
      auVar27._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar21._12_4_;
      auVar27._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar21._16_4_;
      auVar27._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar21._20_4_;
      auVar27._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar21._24_4_;
      auVar27._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar21._28_4_;
      auVar27._32_4_ = (uint)(bVar10 & 1) * auVar21._32_4_;
      auVar27._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar21._36_4_;
      auVar27._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar21._40_4_;
      auVar27._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar21._44_4_;
      auVar27._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar21._48_4_;
      auVar27._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar21._52_4_;
      auVar27._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar21._56_4_;
      auVar27._60_4_ = (uint)(bVar10 >> 7) * auVar21._60_4_;
      auVar21 = vpmulld_avx512f(auVar27,auVar24);
      uVar14 = uVar14 + 0x10;
    } while ((uVar13 + 0xf & 0x1fffffff0) != uVar14);
    auVar20 = vmovdqa32_avx512f(auVar21);
    auVar23._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar24._0_4_;
    bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar24._4_4_;
    bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar24._8_4_;
    bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar24._12_4_;
    bVar5 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * auVar24._16_4_;
    bVar5 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * auVar24._20_4_;
    bVar5 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * auVar24._24_4_;
    bVar5 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * auVar24._28_4_;
    auVar23._32_4_ =
         (uint)(bVar10 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar24._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar23._36_4_ = (uint)bVar5 * auVar20._36_4_ | (uint)!bVar5 * auVar24._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar23._40_4_ = (uint)bVar5 * auVar20._40_4_ | (uint)!bVar5 * auVar24._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar23._44_4_ = (uint)bVar5 * auVar20._44_4_ | (uint)!bVar5 * auVar24._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar23._48_4_ = (uint)bVar5 * auVar20._48_4_ | (uint)!bVar5 * auVar24._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar23._52_4_ = (uint)bVar5 * auVar20._52_4_ | (uint)!bVar5 * auVar24._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar23._56_4_ = (uint)bVar5 * auVar20._56_4_ | (uint)!bVar5 * auVar24._56_4_;
    auVar23._60_4_ =
         (uint)(bVar10 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar24._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar23,1);
    auVar20 = vpmulld_avx512f(auVar23,ZEXT3264(auVar19));
    auVar6 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    iVar29 = auVar6._0_4_;
  }
  uVar12 = iVar29 * (dEdxi->d).bd;
  uVar13 = (ulong)uVar12;
  if (uVar12 != uVar11) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  pfVar2 = dEdxi->v;
  uVar14 = uVar13;
  if ((((ulong)pfVar2 & 3) == 0) &&
     (uVar14 = (ulong)(-((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 0xf), uVar13 <= uVar14)) {
    uVar14 = uVar13;
  }
  pfVar3 = dEdf->v;
  pfVar4 = pTVar1->v;
  uVar16 = uVar13 - uVar14;
  uVar15 = uVar16 + 0xf;
  if (-1 < (long)uVar16) {
    uVar15 = uVar16;
  }
  if (uVar14 != 0) {
    uVar17 = 0;
    do {
      pfVar2[uVar17] = pfVar3[uVar17] / pfVar4[uVar17] + pfVar2[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  uVar15 = (uVar15 & 0xfffffffffffffff0) + uVar14;
  if (0xf < (long)uVar16) {
    do {
      auVar20 = vrcp14ps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar14));
      auVar21 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar3 + uVar14),auVar20);
      auVar22 = vfmsub213ps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar14),auVar21,
                                    *(undefined1 (*) [64])(pfVar3 + uVar14));
      auVar20 = vfnmadd213ps_avx512f(auVar22,auVar20,auVar21);
      auVar20 = vaddps_avx512f(auVar20,*(undefined1 (*) [64])(pfVar2 + uVar14));
      *(undefined1 (*) [64])(pfVar2 + uVar14) = auVar20;
      uVar14 = uVar14 + 0x10;
    } while ((long)uVar14 < (long)uVar15);
  }
  if ((long)uVar15 < (long)uVar13) {
    do {
      pfVar2[uVar15] = pfVar3[uVar15] / pfVar4[uVar15] + pfVar2[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar13 != uVar15);
  }
  return;
}

Assistant:

void Log::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
#if HAVE_CUDA
  gpu::vlog_backward(fx.d.size(), xs[0]->v, dEdf.v, dEdxi.v);
#else
  dEdxi.vec() += dEdf.vec().cwiseQuotient(xs[0]->vec());
#endif
}